

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simUtils.c
# Opt level: O2

int Sim_UtilCountSuppSizes(Sim_Man_t *p,int fStruct)

{
  Abc_Obj_t *pAVar1;
  int iVar2;
  Abc_Ntk_t *pNtk;
  uint uVar3;
  ulong uVar4;
  int i;
  long lVar5;
  
  pNtk = p->pNtk;
  if (fStruct == 0) {
    iVar2 = 0;
    for (lVar5 = 0; lVar5 < pNtk->vCos->nSize; lVar5 = lVar5 + 1) {
      Abc_NtkCo(pNtk,(int)lVar5);
      uVar4 = 0;
      while( true ) {
        pNtk = p->pNtk;
        uVar3 = (uint)uVar4;
        if (pNtk->vCis->nSize <= (int)uVar3) break;
        Abc_NtkCi(pNtk,uVar3);
        iVar2 = iVar2 + (uint)((*(uint *)((long)p->vSuppFun->pArray[lVar5] + (uVar4 >> 5) * 4) >>
                                (uVar3 & 0x1f) & 1) != 0);
        uVar4 = (ulong)(uVar3 + 1);
      }
    }
  }
  else {
    iVar2 = 0;
    for (i = 0; i < pNtk->vCos->nSize; i = i + 1) {
      pAVar1 = Abc_NtkCo(pNtk,i);
      uVar4 = 0;
      while( true ) {
        pNtk = p->pNtk;
        uVar3 = (uint)uVar4;
        if (pNtk->vCis->nSize <= (int)uVar3) break;
        Abc_NtkCi(pNtk,uVar3);
        iVar2 = iVar2 + (uint)((*(uint *)((long)p->vSuppStr->pArray[pAVar1->Id] + (uVar4 >> 5) * 4)
                                >> (uVar3 & 0x1f) & 1) != 0);
        uVar4 = (ulong)(uVar3 + 1);
      }
    }
  }
  return iVar2;
}

Assistant:

int Sim_UtilCountSuppSizes( Sim_Man_t * p, int fStruct )
{
    Abc_Obj_t * pNode, * pNodeCi;
    int i, v, Counter;
    Counter = 0;
    if ( fStruct )
    {
        Abc_NtkForEachCo( p->pNtk, pNode, i )
            Abc_NtkForEachCi( p->pNtk, pNodeCi, v )
                Counter += Sim_SuppStrHasVar( p->vSuppStr, pNode, v );
    }
    else
    {
        Abc_NtkForEachCo( p->pNtk, pNode, i )
            Abc_NtkForEachCi( p->pNtk, pNodeCi, v )
                Counter += Sim_SuppFunHasVar( p->vSuppFun, i, v );
    }
    return Counter;
}